

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setop_relation.cpp
# Opt level: O2

void __thiscall
duckdb::SetOpRelation::SetOpRelation
          (SetOpRelation *this,shared_ptr<duckdb::Relation,_true> *left_p,
          shared_ptr<duckdb::Relation,_true> *right_p,SetOperationType setop_type_p,bool setop_all)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Relation *pRVar3;
  InvalidInputException *this_00;
  string local_60;
  _func_int **local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  pRVar3 = shared_ptr<duckdb::Relation,_true>::operator->(left_p);
  ::std::__cxx11::string::string
            ((string *)&local_60,anon_var_dwarf_4b0ffdd + 9,(allocator *)&local_40);
  Relation::Relation(&this->super_Relation,&pRVar3->context,SET_OPERATION_RELATION,&local_60);
  ::std::__cxx11::string::~string((string *)&local_60);
  (this->super_Relation)._vptr_Relation = (_func_int **)&PTR__SetOpRelation_027c10e0;
  (this->left).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (left_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (left_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (left_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->left).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (this->left).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var2;
  (left_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->right).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (right_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (right_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (right_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->right).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (this->right).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  (right_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  this->setop_type = setop_type_p;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->setop_all = setop_all;
  pRVar3 = shared_ptr<duckdb::Relation,_true>::operator->(&this->left);
  shared_ptr<duckdb::ClientContextWrapper,_true>::operator->(&pRVar3->context);
  ClientContextWrapper::GetContext((ClientContextWrapper *)&local_60);
  pRVar3 = shared_ptr<duckdb::Relation,_true>::operator->(&this->right);
  shared_ptr<duckdb::ClientContextWrapper,_true>::operator->(&pRVar3->context);
  ClientContextWrapper::GetContext((ClientContextWrapper *)&local_40);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60._M_string_length);
  if ((_func_int **)local_60._M_dataplus._M_p == local_40) {
    Relation::TryBindRelation(&this->super_Relation,&this->columns);
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_60,"Cannot combine LEFT and RIGHT relations of different connections!"
             ,(allocator *)&local_40);
  InvalidInputException::InvalidInputException(this_00,&local_60);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

SetOpRelation::SetOpRelation(shared_ptr<Relation> left_p, shared_ptr<Relation> right_p, SetOperationType setop_type_p,
                             bool setop_all)
    : Relation(left_p->context, RelationType::SET_OPERATION_RELATION), left(std::move(left_p)),
      right(std::move(right_p)), setop_type(setop_type_p), setop_all(setop_all) {
	if (left->context->GetContext() != right->context->GetContext()) {
		throw InvalidInputException("Cannot combine LEFT and RIGHT relations of different connections!");
	}
	TryBindRelation(columns);
}